

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

TypeID NULLCTypeInfo::GetType(NULLCArray name)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  if (name.ptr != (char *)0x0) {
    uVar1 = NULLC::GetStringHash(name.ptr);
    if (*(uint *)(linker + 0x20c) != 0) {
      puVar2 = (uint *)(*(long *)(linker + 0x200) + 0x28);
      uVar3 = 0;
      do {
        if (*puVar2 == uVar1) {
          return (TypeID)uVar3;
        }
        uVar3 = uVar3 + 1;
        puVar2 = puVar2 + 0x14;
      } while (*(uint *)(linker + 0x20c) != uVar3);
    }
  }
  return (TypeID)0;
}

Assistant:

TypeID GetType(NULLCArray name)
	{
		if(!name.ptr)
			return getTypeID(0);

		unsigned hash = NULLC::GetStringHash(name.ptr);

		for(unsigned i = 0; i < linker->exTypes.size(); i++)
		{
			if(linker->exTypes[i].nameHash == hash)
				return getTypeID(i);
		}
		return getTypeID(0);
	}